

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx2.cpp
# Opt level: O0

int ncnn::binary_op_scalar_inplace_pack4<ncnn::binary_op_max_pack4>(Mat *a,float b,Option *opt)

{
  long in_RDI;
  undefined4 extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  __m128 afVar1;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  __m128 _b;
  int size;
  int channels;
  int h;
  int w;
  binary_op_max_pack4 op;
  __m128 local_f8;
  int local_e4;
  int in_stack_ffffffffffffff24;
  Mat *in_stack_ffffffffffffff28;
  __m128 *local_98;
  int local_8c;
  float local_88 [7];
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  binary_op_max_pack4 local_59 [25];
  __m128 *local_40;
  undefined8 local_38;
  float afStack_30 [4];
  __m128 *local_20;
  
  local_60 = *(int *)(in_RDI + 0x2c);
  local_64 = *(int *)(in_RDI + 0x30);
  local_68 = *(int *)(in_RDI + 0x38);
  local_6c = local_60 * local_64;
  for (local_8c = 0; local_8c < local_68; local_8c = local_8c + 1) {
    Mat::channel(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
    local_98 = (__m128 *)Mat::operator_cast_to_float_((Mat *)&stack0xffffffffffffff20);
    Mat::~Mat((Mat *)0x5761ac);
    for (local_e4 = 0; local_e4 < local_6c; local_e4 = local_e4 + 1) {
      local_40 = local_98;
      local_f8 = *local_98;
      afVar1 = binary_op_max_pack4::operator()(local_59,&local_f8,(__m128 *)local_88);
      local_38 = afVar1._0_8_;
      afVar1[2] = (float)extraout_XMM0_Dc;
      afVar1[0] = (float)(int)local_38;
      afVar1[1] = (float)(int)((ulong)local_38 >> 0x20);
      afVar1[3] = extraout_XMM0_Dd;
      local_20 = local_98;
      local_f8._8_8_ = afVar1._8_8_;
      afStack_30[0] = local_f8[2];
      afStack_30[1] = local_f8[3];
      *(undefined8 *)*local_98 = local_38;
      *(undefined8 *)(*local_98 + 2) = local_f8._8_8_;
      local_98 = local_98 + 1;
      local_f8 = afVar1;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar_inplace_pack4(Mat& a, float b, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;

    __m128 _b = _mm_set1_ps((float)b);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        for (int i = 0; i < size; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = op(_p, _b);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
    }

    return 0;
}